

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void cleanuptypeinfo(rnntypeinfo *ti)

{
  int local_14;
  int i;
  rnntypeinfo *ti_local;
  
  for (local_14 = 0; local_14 < ti->bitfieldsnum; local_14 = local_14 + 1) {
    freebitfield(ti->bitfields[local_14]);
  }
  free(ti->bitfields);
  for (local_14 = 0; local_14 < ti->valsnum; local_14 = local_14 + 1) {
    freevalue(ti->vals[local_14]);
  }
  free(ti->vals);
  free(ti->name);
  return;
}

Assistant:

static void cleanuptypeinfo(struct rnntypeinfo *ti) {
	int i;
	for (i = 0; i < ti->bitfieldsnum; i++)
		freebitfield(ti->bitfields[i]);
	free(ti->bitfields);

	for (i = 0; i < ti->valsnum; i++)
		freevalue(ti->vals[i]);
	free(ti->vals);

	free(ti->name);
}